

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

lhash_bmap_rec * lhMapFindBucket(lhash_kv_engine *pEngine,pgno iLogic)

{
  lhash_bmap_rec *local_28;
  lhash_bmap_rec *pRec;
  pgno iLogic_local;
  lhash_kv_engine *pEngine_local;
  
  if (pEngine->nBuckRec != 0) {
    for (local_28 = pEngine->apMap[iLogic & pEngine->nBuckSize - 1];
        local_28 != (lhash_bmap_rec *)0x0; local_28 = local_28->pNextCol) {
      if (local_28->iLogic == iLogic) {
        return local_28;
      }
    }
  }
  return (lhash_bmap_rec *)0x0;
}

Assistant:

static lhash_bmap_rec * lhMapFindBucket(lhash_kv_engine *pEngine,pgno iLogic)
{
	lhash_bmap_rec *pRec;
	if( pEngine->nBuckRec < 1 ){
		/* Don't bother */
		return 0;
	}
	pRec = pEngine->apMap[iLogic & (pEngine->nBuckSize - 1)];
	for(;;){
		if( pRec == 0 ){
			break;
		}
		if( pRec->iLogic == iLogic ){
			return pRec;
		}
		/* Point to the next entry */
		pRec = pRec->pNextCol;
	}
	/* No such record */
	return 0;
}